

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedCollator::getSortKey
          (RuleBasedCollator *this,UChar *s,int32_t length,uint8_t *dest,int32_t capacity)

{
  int32_t iVar1;
  uint8_t noDest [1];
  UErrorCode errorCode;
  FixedSortKeyByteSink sink;
  uint8_t local_2d;
  UErrorCode local_2c;
  SortKeyByteSink local_28;
  
  iVar1 = 0;
  if ((-1 < capacity && (length == 0 || s != (UChar *)0x0)) &&
     (iVar1 = 0, dest != (uint8_t *)0x0 || capacity == 0)) {
    local_28.buffer_ = (char *)dest;
    if (dest == (uint8_t *)0x0) {
      local_28.buffer_ = (char *)&local_2d;
    }
    if (dest == (uint8_t *)0x0) {
      capacity = 0;
    }
    local_28.appended_ = 0;
    local_28.ignore_ = 0;
    local_2d = '\0';
    local_28.super_ByteSink._vptr_ByteSink = (_func_int **)&PTR__SortKeyByteSink_003c8608;
    local_2c = U_ZERO_ERROR;
    local_28.capacity_ = capacity;
    writeSortKey(this,s,length,&local_28,&local_2c);
    iVar1 = 0;
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar1 = local_28.appended_;
    }
    SortKeyByteSink::~SortKeyByteSink(&local_28);
  }
  return iVar1;
}

Assistant:

int32_t
RuleBasedCollator::getSortKey(const UChar *s, int32_t length,
                              uint8_t *dest, int32_t capacity) const {
    if((s == NULL && length != 0) || capacity < 0 || (dest == NULL && capacity > 0)) {
        return 0;
    }
    uint8_t noDest[1] = { 0 };
    if(dest == NULL) {
        // Distinguish pure preflighting from an allocation error.
        dest = noDest;
        capacity = 0;
    }
    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), capacity);
    UErrorCode errorCode = U_ZERO_ERROR;
    writeSortKey(s, length, sink, errorCode);
    return U_SUCCESS(errorCode) ? sink.NumberOfBytesAppended() : 0;
}